

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O2

ZNames * __thiscall
icu_63::TimeZoneNamesImpl::loadTimeZoneNames
          (TimeZoneNamesImpl *this,UnicodeString *tzID,UErrorCode *status)

{
  UHashtable *cache;
  int32_t iVar1;
  ZNames *pZVar2;
  UChar **names;
  ZNames *pZVar3;
  ZNamesLoader loader;
  UChar tzIDKey [129];
  Char16Ptr local_180;
  char16_t *local_178;
  ZNamesLoader local_168;
  char16_t local_128 [132];
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    local_180.p_ = local_128;
    iVar1 = UnicodeString::extract(tzID,&local_180,0x81,status);
    local_178 = local_180.p_;
    local_128[iVar1] = L'\0';
    pZVar2 = (ZNames *)uhash_get_63(this->fTZNamesMap,local_128);
    if (pZVar2 == (ZNames *)0x0) {
      local_168.super_ResourceSink.super_UObject._vptr_UObject =
           (UObject)&PTR__ZNamesLoader_003dbf90;
      local_168.names[0] = (UChar *)0x0;
      local_168.names[1] = (UChar *)0x0;
      local_168.names[2] = (UChar *)0x0;
      local_168.names[3] = (UChar *)0x0;
      local_168.names[4] = (UChar *)0x0;
      local_168.names[5] = (UChar *)0x0;
      local_168.names[6] = (UChar *)0x0;
      ZNames::ZNamesLoader::loadTimeZone(&local_168,this->fZoneStrings,tzID,status);
      cache = this->fTZNamesMap;
      names = ZNames::ZNamesLoader::getNames(&local_168);
      pZVar3 = (ZNames *)ZNames::createTimeZoneAndPutInCache(cache,names,tzID,status);
      pZVar2 = (ZNames *)0x0;
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        pZVar2 = pZVar3;
      }
      ResourceSink::~ResourceSink(&local_168.super_ResourceSink);
    }
  }
  else {
    pZVar2 = (ZNames *)0x0;
  }
  return pZVar2;
}

Assistant:

const UChar* getName(UTimeZoneNameType type) const {
        UTimeZoneNameTypeIndex index = getTZNameTypeIndex(type);
        return index >= 0 ? fNames[index] : NULL;
    }